

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O2

void __thiscall
obs::observers<Observer>::notify_observers<int>
          (observers<Observer> *this,offset_in_observer_type_to_subr method,int args)

{
  bool bVar1;
  Observer *pOVar2;
  long *plVar3;
  undefined4 in_ECX;
  code *pcVar4;
  undefined4 in_register_00000014;
  iterator __end0;
  iterator __begin0;
  iterator iStack_78;
  iterator local_50;
  
  safe_list<Observer>::begin(&local_50,&this->m_observers);
  safe_list<Observer>::end(&iStack_78,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&local_50,&iStack_78);
    if (!bVar1) break;
    pOVar2 = safe_list<Observer>::iterator::operator*(&local_50);
    if (pOVar2 != (Observer *)0x0) {
      plVar3 = (long *)((long)&pOVar2->_vptr_Observer + CONCAT44(in_register_00000014,args));
      pcVar4 = (code *)method;
      if ((method & 1) != 0) {
        pcVar4 = *(code **)(*plVar3 + -1 + method);
      }
      (*pcVar4)(plVar3,in_ECX);
    }
    safe_list<Observer>::iterator::operator++(&local_50);
  }
  safe_list<Observer>::iterator::~iterator(&iStack_78);
  safe_list<Observer>::iterator::~iterator(&local_50);
  return;
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }